

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateRAIIHandleConstructorArgument_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this,ParamData *param,bool definition,
          bool singular,bool takesOwnership)

{
  size_type sVar1;
  bool bVar2;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string argumentType;
  string argumentName;
  string local_100;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_b8 = __return_storage_ptr__;
  bVar2 = TypeInfo::isConstPointer(&param->type);
  this_00 = local_b8;
  psVar4 = &(param->type).type;
  if (bVar2) {
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            starts_with(psVar4,"Vk");
    if (!bVar2) {
      __assert_fail("param.type.type.starts_with( \"Vk\" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x253f,
                    "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                   );
    }
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            starts_with(&param->name,"p");
    if (!bVar2) {
      __assert_fail("param.name.starts_with( \"p\" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2540,
                    "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                   );
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"p",(allocator<char> *)&local_d8);
    stripPrefix(&local_100,&param->name,&local_b0);
    anon_unknown.dwarf_dd40c::startLowerCase(&local_90,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b0);
    anon_unknown.dwarf_dd40c::generateNamespacedType(&local_100,psVar4);
    this_00 = local_b8;
    sVar1 = (param->lenExpression)._M_string_length;
    if (param->optional == true) {
      if (sVar1 != 0) {
        __assert_fail("param.lenExpression.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2545,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      std::operator+(&local_50,"VULKAN_HPP_NAMESPACE::Optional<const ",&local_100);
      std::operator+(&local_70,&local_50,"> ");
      std::operator+(&local_d8,&local_70,&local_90);
      __rhs = " = nullptr";
      if (definition) {
        __rhs = "";
      }
      std::operator+(&local_b0,&local_d8,__rhs);
      this_00 = local_b8;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (local_b8,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_70);
      pbVar3 = &local_50;
    }
    else {
      if (sVar1 == 0) {
        std::operator+(&local_d8,&local_100," const & ");
        std::operator+(&local_b0,&local_d8,&local_90);
        pbVar3 = &local_b0;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (this_00,pbVar3);
      }
      else {
        if (!singular) {
          std::operator+(&local_70,"VULKAN_HPP_NAMESPACE::ArrayProxy<",&local_100);
          std::operator+(&local_d8,&local_70,"> const & ");
          std::operator+(&local_b0,&local_d8,&local_90);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (this_00,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d8);
          pbVar3 = &local_70;
          goto LAB_001565ba;
        }
        std::operator+(&local_d8,&local_100," const & ");
        stripPluralS(&local_70,this,&local_90);
        std::operator+(&local_b0,&local_d8,&local_70);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        pbVar3 = &local_70;
      }
      std::__cxx11::string::~string((string *)pbVar3);
      pbVar3 = &local_d8;
    }
LAB_001565ba:
    std::__cxx11::string::~string((string *)pbVar3);
    std::__cxx11::string::~string((string *)&local_100);
LAB_001565c9:
    psVar4 = &local_90;
  }
  else {
    bVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::contains(&specialPointerTypes_abi_cxx11_,psVar4);
    if (bVar2) {
      if (param->optional == true) {
        __assert_fail("!param.optional",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2557,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      bVar2 = TypeInfo::isNonConstPointer(&param->type);
      if (!bVar2) {
        __assert_fail("param.type.isNonConstPointer()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2558,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      std::operator+(&local_100,psVar4," & ");
      std::operator+(&local_90,&local_100,&param->name);
    }
    else {
      bVar2 = TypeInfo::isValue(&param->type);
      if ((!bVar2) || (bVar2 = isHandleType(this,psVar4), !bVar2)) {
        if (param->optional != true) {
          if ((param->arraySizes).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (param->arraySizes).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"VULKAN_HPP_NAMESPACE",(allocator<char> *)&local_70);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d8,"Vk",(allocator<char> *)&local_50);
            TypeInfo::compose(&local_100,&param->type,&local_b0,&local_d8);
            std::operator+(&local_90,&local_100," ");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(this_00,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_d8);
            pbVar3 = &local_b0;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d8,"VULKAN_HPP_NAMESPACE",(allocator<char> *)&local_50);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Vk",&local_d9);
            TypeInfo::compose(&local_b0,&param->type,&local_d8,&local_70);
            anon_unknown.dwarf_dd40c::generateStandardArray(&local_100,&local_b0,&param->arraySizes)
            ;
            std::operator+(&local_90,&local_100," const & ");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(this_00,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_70);
            pbVar3 = &local_d8;
          }
          std::__cxx11::string::~string((string *)pbVar3);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (this_00,&param->name);
          return this_00;
        }
        __assert_fail("!param.optional",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x256e,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      if (!takesOwnership) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"Vk",(allocator<char> *)&local_d8);
        stripPrefix(&local_100,psVar4,&local_b0);
        std::operator+(&local_90,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::",&local_100);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (this_00,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_b0);
        if (param->optional == true) {
          std::operator+(&local_100,"VULKAN_HPP_NAMESPACE::Optional<const ",this_00);
          std::operator+(&local_90,&local_100,">");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (this_00,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_100);
        }
        std::operator+(&local_90," const & ",&param->name);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this_00,&local_90);
        goto LAB_001565c9;
      }
      if (param->optional == true) {
        __assert_fail("!param.optional",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x255f,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      std::operator+(&local_100,psVar4," ");
      std::operator+(&local_90,&local_100,&param->name);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    psVar4 = &local_100;
  }
  std::__cxx11::string::~string((string *)psVar4);
  return this_00;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument( ParamData const & param, bool definition, bool singular, bool takesOwnership ) const
{
  std::string argument;
  if ( param.type.isConstPointer() )
  {
    assert( param.type.type.starts_with( "Vk" ) );
    assert( param.name.starts_with( "p" ) );
    std::string argumentName = startLowerCase( stripPrefix( param.name, "p" ) );
    std::string argumentType = generateNamespacedType( param.type.type );
    if ( param.optional )
    {
      assert( param.lenExpression.empty() );
      argument = "VULKAN_HPP_NAMESPACE::Optional<const " + argumentType + "> " + argumentName + ( definition ? "" : " = nullptr" );
    }
    else if ( param.lenExpression.empty() )
    {
      argument = argumentType + " const & " + argumentName;
    }
    else if ( singular )
    {
      argument = argumentType + " const & " + stripPluralS( argumentName );
    }
    else
    {
      argument = "VULKAN_HPP_NAMESPACE::ArrayProxy<" + argumentType + "> const & " + argumentName;
    }
  }
  else if ( specialPointerTypes.contains( param.type.type ) )
  {
    assert( !param.optional );
    assert( param.type.isNonConstPointer() );
    argument = param.type.type + " & " + param.name;
  }
  else if ( ( param.type.isValue() ) && isHandleType( param.type.type ) )
  {
    if ( takesOwnership )
    {
      assert( !param.optional );
      argument = param.type.type + " " + param.name;
    }
    else
    {
      argument = "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::" + stripPrefix( param.type.type, "Vk" );
      if ( param.optional )
      {
        argument = "VULKAN_HPP_NAMESPACE::Optional<const " + argument + ">";
      }
      argument += " const & " + param.name;
    }
  }
  else
  {
    assert( !param.optional );
    if ( param.arraySizes.empty() )
    {
      argument = param.type.compose( "VULKAN_HPP_NAMESPACE" ) + " ";
    }
    else
    {
      argument = generateStandardArray( param.type.compose( "VULKAN_HPP_NAMESPACE" ), param.arraySizes ) + " const & ";
    }
    argument += param.name;
  }
  return argument;
}